

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv.cpp
# Opt level: O0

int32_t ucnv_fromUCountPending_63(UConverter *cnv,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  UErrorCode *status_local;
  UConverter *cnv_local;
  
  if ((status == (UErrorCode *)0x0) || (UVar1 = U_FAILURE(*status), UVar1 != '\0')) {
    return -1;
  }
  if (cnv == (UConverter *)0x0) {
    *status = U_ILLEGAL_ARGUMENT_ERROR;
    return -1;
  }
  if (-1 < cnv->preFromUFirstCP) {
    iVar2 = 2;
    if ((uint)cnv->preFromUFirstCP < 0x10000) {
      iVar2 = 1;
    }
    return iVar2 + cnv->preFromULength;
  }
  if (cnv->preFromULength < '\0') {
    return -(int)cnv->preFromULength;
  }
  if (0 < cnv->fromUChar32) {
    return 1;
  }
  return 0;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucnv_fromUCountPending(const UConverter* cnv, UErrorCode* status)
{
    if(status == NULL || U_FAILURE(*status)){
        return -1;
    }
    if(cnv == NULL){
        *status = U_ILLEGAL_ARGUMENT_ERROR;
        return -1;
    }

    if(cnv->preFromUFirstCP >= 0){
        return U16_LENGTH(cnv->preFromUFirstCP)+cnv->preFromULength ;
    }else if(cnv->preFromULength < 0){
        return -cnv->preFromULength ;
    }else if(cnv->fromUChar32 > 0){
        return 1;
    }
    return 0; 

}